

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_resources
          (CompilerReflection *this,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources)

{
  ID *__k;
  Stream *pSVar1;
  StorageClass SVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  mapped_type *pmVar6;
  Bitset *pBVar7;
  SPIRType *type;
  size_t sVar8;
  uint64_t uVar9;
  char *pcVar10;
  byte bVar11;
  string *psVar12;
  allocator local_111;
  Bitset *local_110;
  SPIRType *local_108;
  Bitset buffer_flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a0;
  long local_98;
  string local_90;
  Bitset typeflags;
  
  if ((resources->super_VectorView<spirv_cross::Resource>).buffer_size != 0) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&typeflags,tag,(allocator *)&buffer_flags);
    simple_json::Stream::emit_json_key_array(pSVar1,(string *)&typeflags);
    ::std::__cxx11::string::~string((string *)&typeflags);
    local_a0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    psVar12 = (string *)&((resources->super_VectorView<spirv_cross::Resource>).ptr)->name;
    lVar5 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size * 0x30;
    while (lVar5 != 0) {
      local_98 = lVar5;
      local_108 = Compiler::get_type((Compiler *)this,(TypeID)*(uint32_t *)(psVar12 + -0xc));
      __k = &(local_108->super_IVariant).self;
      pmVar6 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_a0,__k);
      Bitset::Bitset(&typeflags,&(pmVar6->decoration).decoration_flags);
      local_110 = Compiler::get_decoration_bitset
                            ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10));
      SVar2 = Compiler::get_storage_class
                        ((Compiler *)this,(VariableID)*(uint32_t *)(psVar12 + -0x10));
      pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
      bVar11 = 1;
      if ((pBVar7->lower & 4) == 0) {
        pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
        bVar11 = ((byte)pBVar7->lower & 8) >> 3;
      }
      uVar3 = *(uint *)(psVar12 + (ulong)(SVar2 != StorageClassPushConstant & bVar11) * 8 + -0x10);
      simple_json::Stream::begin_json_object
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (*(int *)&(local_108->super_IVariant).field_0xc == 0xf) {
        ::std::__cxx11::string::string((string *)&buffer_flags,"type",&local_111);
        ::std::__cxx11::to_string(&local_90,*(uint *)(psVar12 + -8));
        ::std::operator+(&local_c0,"_",&local_90);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,&local_c0);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
      }
      else {
        ::std::__cxx11::string::string((string *)&buffer_flags,"type",(allocator *)&local_90);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_c0,this,local_108,0);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,&local_c0);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
      }
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&buffer_flags,"name",(allocator *)&local_90);
      if (*(long *)(psVar12 + 8) == 0) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[3])(&local_c0,this,(ulong)uVar3);
      }
      else {
        ::std::__cxx11::string::string((string *)&local_c0,psVar12);
      }
      simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,&local_c0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&buffer_flags);
      if ((local_108->storage == StorageClassStorageBuffer) ||
         ((local_108->storage == StorageClassUniform && (((byte)typeflags.lower & 8) != 0)))) {
        Compiler::get_buffer_block_flags
                  (&buffer_flags,(Compiler *)this,(VariableID)*(uint32_t *)(psVar12 + -0x10));
        uVar3 = (uint)buffer_flags.lower;
        if ((uVar3 >> 0x19 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string((string *)&local_c0,"writeonly",(allocator *)&local_90);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_c0,true);
          ::std::__cxx11::string::~string((string *)&local_c0);
          uVar3 = (uint)buffer_flags.lower;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string((string *)&local_c0,"readonly",(allocator *)&local_90);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_c0,true);
          ::std::__cxx11::string::~string((string *)&local_c0);
          uVar3 = (uint)buffer_flags.lower;
        }
        if ((uVar3 >> 0x13 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string((string *)&local_c0,"restrict",(allocator *)&local_90);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_c0,true);
          ::std::__cxx11::string::~string((string *)&local_c0);
          uVar3 = (uint)buffer_flags.lower;
        }
        if ((uVar3 >> 0x17 & 1) != 0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string((string *)&local_c0,"coherent",(allocator *)&local_90);
          simple_json::Stream::emit_json_key_value(pSVar1,&local_c0,true);
          ::std::__cxx11::string::~string((string *)&local_c0);
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&buffer_flags.higher._M_h);
      }
      emit_type_array(this,local_108);
      if (bVar11 != 0) {
        SVar2 = Compiler::get_storage_class
                          ((Compiler *)this,(VariableID)*(uint32_t *)(psVar12 + -0x10));
        if (SVar2 != StorageClassUniform) {
          SVar2 = Compiler::get_storage_class
                            ((Compiler *)this,(VariableID)*(uint32_t *)(psVar12 + -0x10));
          if (SVar2 != StorageClassUniformConstant) {
            SVar2 = Compiler::get_storage_class
                              ((Compiler *)this,(VariableID)*(uint32_t *)(psVar12 + -0x10));
            if (SVar2 != StorageClassStorageBuffer) goto LAB_002817a1;
          }
        }
        type = Compiler::get_type((Compiler *)this,(TypeID)*(uint32_t *)(psVar12 + -8));
        sVar8 = Compiler::get_declared_struct_size((Compiler *)this,type);
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"block_size",(allocator *)&local_c0);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,(uint32_t)sVar8);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
      }
LAB_002817a1:
      if (local_108->storage == StorageClassPushConstant) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string
                  ((string *)&buffer_flags,"push_constant",(allocator *)&local_c0);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,true);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
      }
      uVar9 = local_110->lower;
      if (((uint)uVar9 >> 0x1e & 1) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"location",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),DecorationLocation);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 & 0x10) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"row_major",(allocator *)&local_c0);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,true);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 & 0x20) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string
                  ((string *)&buffer_flags,"column_major",(allocator *)&local_c0);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,true);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 >> 0x20 & 1) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"index",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),DecorationIndex);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((local_108->storage != StorageClassPushConstant) && ((uVar9 & 0x400000000) != 0)) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"set",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),
                           DecorationDescriptorSet);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 >> 0x21 & 1) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"binding",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),DecorationBinding);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 >> 0x2b & 1) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string
                  ((string *)&buffer_flags,"input_attachment_index",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),
                           DecorationInputAttachmentIndex);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
        uVar9 = local_110->lower;
      }
      if ((uVar9 >> 0x23 & 1) != 0) {
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&buffer_flags,"offset",(allocator *)&local_c0);
        uVar4 = Compiler::get_decoration
                          ((Compiler *)this,(ID)*(uint32_t *)(psVar12 + -0x10),DecorationOffset);
        simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,uVar4);
        ::std::__cxx11::string::~string((string *)&buffer_flags);
      }
      if ((*(int *)&(local_108->super_IVariant).field_0xc == 0x10) &&
         ((local_108->image).sampled == 2)) {
        pcVar10 = CompilerGLSL::format_to_glsl(&this->super_CompilerGLSL,(local_108->image).format);
        if (pcVar10 != (char *)0x0) {
          pSVar1 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__cxx11::string::string((string *)&buffer_flags,"format",(allocator *)&local_90);
          ::std::__cxx11::string::string((string *)&local_c0,pcVar10,&local_111);
          simple_json::Stream::emit_json_key_value(pSVar1,(string *)&buffer_flags,&local_c0);
          ::std::__cxx11::string::~string((string *)&local_c0);
          ::std::__cxx11::string::~string((string *)&buffer_flags);
        }
      }
      simple_json::Stream::end_json_object
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&typeflags.higher._M_h);
      psVar12 = psVar12 + 0x30;
      lVar5 = local_98 + -0x30;
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}